

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::texParameteri
          (ReferenceContext *this,deUint32 target,deUint32 pname,int value)

{
  FilterMode FVar1;
  WrapMode WVar2;
  pointer pTVar3;
  long lVar4;
  pointer pTVar5;
  Texture1D *pTVar6;
  
  pTVar5 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  if (target == 0xde0) {
    lVar4 = 0x30;
    pTVar3 = pTVar5;
LAB_0152a507:
    pTVar6 = (Texture1D *)((long)&pTVar5->tex1DBinding + lVar4);
    if (pTVar3->tex1DBinding != (Texture1D *)0x0) {
      pTVar6 = pTVar3->tex1DBinding;
    }
    switch(pname) {
    case 0x2800:
      FVar1 = mapGLFilterMode(value);
      if (FVar1 < NEAREST_MIPMAP_NEAREST) {
        *(FilterMode *)((long)&(pTVar6->super_Texture).m_sampler + 0x10) = FVar1;
        return;
      }
      break;
    case 0x2801:
      FVar1 = mapGLFilterMode(value);
      if (FVar1 != FILTERMODE_LAST) {
        *(FilterMode *)((long)&(pTVar6->super_Texture).m_sampler + 0xc) = FVar1;
        return;
      }
      break;
    case 0x2802:
      if (value == 0x8370) {
        WVar2 = MIRRORED_REPEAT_GL;
LAB_0152a614:
        (pTVar6->super_Texture).m_sampler.wrapS = WVar2;
        return;
      }
      if (value == 0x812f) {
        WVar2 = CLAMP_TO_EDGE;
        goto LAB_0152a614;
      }
      if (value == 0x2901) {
        WVar2 = REPEAT_GL;
        goto LAB_0152a614;
      }
      break;
    case 0x2803:
      if (value == 0x8370) {
        WVar2 = MIRRORED_REPEAT_GL;
LAB_0152a621:
        *(WrapMode *)((long)&(pTVar6->super_Texture).m_sampler + 4) = WVar2;
        return;
      }
      if (value == 0x812f) {
        WVar2 = CLAMP_TO_EDGE;
        goto LAB_0152a621;
      }
      if (value == 0x2901) {
        WVar2 = REPEAT_GL;
        goto LAB_0152a621;
      }
      break;
    default:
      if (pname == 0x8072) {
        if (value == 0x8370) {
          WVar2 = MIRRORED_REPEAT_GL;
LAB_0152a60b:
          *(WrapMode *)((long)&(pTVar6->super_Texture).m_sampler + 8) = WVar2;
          return;
        }
        if (value == 0x812f) {
          WVar2 = CLAMP_TO_EDGE;
          goto LAB_0152a60b;
        }
        if (value == 0x2901) {
          WVar2 = REPEAT_GL;
          goto LAB_0152a60b;
        }
      }
      else {
        if (pname != 0x813d) goto LAB_0152a569;
        if (-1 < value) {
          (pTVar6->super_Texture).m_maxLevel = value;
          return;
        }
      }
    }
    if (this->m_lastError == 0) {
      this->m_lastError = 0x501;
    }
  }
  else {
    if (target == 0x9009) {
      lVar4 = 0x3708;
      pTVar3 = (pointer)&pTVar5->texCubeArrayBinding;
      goto LAB_0152a507;
    }
    if (target == 0x806f) {
      lVar4 = 0x3158;
      pTVar3 = (pointer)&pTVar5->tex3DBinding;
      goto LAB_0152a507;
    }
    if (target == 0x8513) {
      lVar4 = 0xb90;
      pTVar3 = (pointer)&pTVar5->texCubeBinding;
      goto LAB_0152a507;
    }
    if (target == 0x8c1a) {
      lVar4 = 0x2ba8;
      pTVar3 = (pointer)&pTVar5->tex2DArrayBinding;
      goto LAB_0152a507;
    }
    if (target == 0xde1) {
      lVar4 = 0x5e0;
      pTVar3 = (pointer)&pTVar5->tex2DBinding;
      goto LAB_0152a507;
    }
LAB_0152a569:
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
  }
  return;
}

Assistant:

void ReferenceContext::texParameteri (deUint32 target, deUint32 pname, int value)
{
	TextureUnit&	unit		= m_textureUnits[m_activeTexture];
	Texture*		texture		= DE_NULL;

	switch (target)
	{
		case GL_TEXTURE_1D:				texture = unit.tex1DBinding			? unit.tex1DBinding			: &unit.default1DTex;			break;
		case GL_TEXTURE_2D:				texture = unit.tex2DBinding			? unit.tex2DBinding			: &unit.default2DTex;			break;
		case GL_TEXTURE_CUBE_MAP:		texture = unit.texCubeBinding		? unit.texCubeBinding		: &unit.defaultCubeTex;			break;
		case GL_TEXTURE_2D_ARRAY:		texture = unit.tex2DArrayBinding	? unit.tex2DArrayBinding	: &unit.default2DArrayTex;		break;
		case GL_TEXTURE_3D:				texture = unit.tex3DBinding			? unit.tex3DBinding			: &unit.default3DTex;			break;
		case GL_TEXTURE_CUBE_MAP_ARRAY:	texture = unit.texCubeArrayBinding	? unit.texCubeArrayBinding	: &unit.defaultCubeArrayTex;	break;

		default:					RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}

	switch (pname)
	{
		case GL_TEXTURE_WRAP_S:
		{
			tcu::Sampler::WrapMode wrapS = mapGLWrapMode(value);
			RC_IF_ERROR(wrapS == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapS = wrapS;
			break;
		}

		case GL_TEXTURE_WRAP_T:
		{
			tcu::Sampler::WrapMode wrapT = mapGLWrapMode(value);
			RC_IF_ERROR(wrapT == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapT = wrapT;
			break;
		}

		case GL_TEXTURE_WRAP_R:
		{
			tcu::Sampler::WrapMode wrapR = mapGLWrapMode(value);
			RC_IF_ERROR(wrapR == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapR = wrapR;
			break;
		}

		case GL_TEXTURE_MIN_FILTER:
		{
			tcu::Sampler::FilterMode minMode = mapGLFilterMode(value);
			RC_IF_ERROR(minMode == tcu::Sampler::FILTERMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().minFilter = minMode;
			break;
		}

		case GL_TEXTURE_MAG_FILTER:
		{
			tcu::Sampler::FilterMode magMode = mapGLFilterMode(value);
			RC_IF_ERROR(magMode != tcu::Sampler::LINEAR && magMode != tcu::Sampler::NEAREST,
						GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().magFilter = magMode;
			break;
		}

		case GL_TEXTURE_MAX_LEVEL:
		{
			RC_IF_ERROR(value < 0, GL_INVALID_VALUE, RC_RET_VOID);
			texture->setMaxLevel(value);
			break;
		}

		default:
			RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}
}